

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makedefs.c
# Opt level: O3

void do_permonst(char *outfile)

{
  bool bVar1;
  bool bVar2;
  FILE *pFVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  size_t sVar10;
  byte *pbVar11;
  char *extraout_RAX;
  char *pcVar12;
  char cVar13;
  byte *pbVar14;
  char *__filename;
  ulong uVar15;
  msghdr *__filename_00;
  char *pcVar16;
  int *unaff_RBP;
  byte bVar17;
  char *pcVar18;
  long lVar19;
  long *plVar20;
  byte bVar21;
  char *__filename_01;
  long lVar22;
  long lVar23;
  long lVar24;
  char *unaff_R12;
  permonst *ppVar25;
  uint uVar26;
  char *unaff_R13;
  char cVar27;
  qthdr *__filename_02;
  msghdr *unaff_R15;
  msghdr *__filename_03;
  char (*__s2) [3];
  char acStack_3f0 [256];
  long alStack_2f0 [33];
  char *pcStack_1e8;
  char *pcStack_1e0;
  char *pcStack_1d8;
  char *pcStack_1d0;
  msghdr *pmStack_1c8;
  code *pcStack_1c0;
  char *pcStack_1b8;
  msghdr *pmStack_1b0;
  char *pcStack_1a8;
  char *pcStack_1a0;
  qthdr *pqStack_198;
  msghdr *pmStack_190;
  code *pcStack_188;
  int iStack_174;
  char acStack_170 [264];
  char *pcStack_68;
  
  pcVar18 = "w+";
  ofp = (FILE *)fopen(outfile,"w+");
  if ((FILE *)ofp != (FILE *)0x0) {
    fputs("/* This source file is generated by \'makedefs\'.  Do not edit. */\n",(FILE *)ofp);
    fwrite("#ifndef PM_H\n#define PM_H\n",0x1a,1,(FILE *)ofp);
    iVar4 = strcmp("giant ant","playermon");
    if (iVar4 != 0) {
      fwrite("\n#define\tPM_PLAYERMON\t(-1)",0x1a,1,(FILE *)ofp);
    }
    cVar27 = '\x01';
    uVar15 = 0;
    ppVar25 = mons;
    do {
      fwrite("\n#define\tPM_",0xc,1,(FILE *)ofp);
      pcVar18 = ppVar25->mname;
      if ((cVar27 == '5') && (iVar4 = strncmp(pcVar18,"were",4), iVar4 == 0)) {
        fwrite("HUMAN_",6,1,(FILE *)ofp);
      }
      strncpy(&tmpdup_buf,pcVar18,0x7f);
      if (tmpdup_buf != '\0') {
        pcVar18 = &DAT_0014f2b1;
        cVar27 = tmpdup_buf;
        do {
          if ((byte)(cVar27 + 0x9fU) < 0x1a) {
            cVar13 = cVar27 + -0x20;
LAB_0010a73c:
            pcVar18[-1] = cVar13;
          }
          else {
            cVar13 = '_';
            if ((byte)(cVar27 + 0xa5U) < 0xe6) goto LAB_0010a73c;
          }
          cVar27 = *pcVar18;
          pcVar18 = pcVar18 + 1;
        } while (cVar27 != '\0');
      }
      fprintf((FILE *)ofp,"%s\t%d",&tmpdup_buf,uVar15 & 0xffffffff);
      uVar15 = uVar15 + 1;
      ppVar25 = mons + uVar15;
      cVar27 = mons[uVar15].mlet;
      if (cVar27 == '\0') {
        fprintf((FILE *)ofp,"\n\n#define\tNUMMONS\t%d\n",uVar15 & 0xffffffff);
        fwrite("\n#endif /* PM_H */\n",0x13,1,(FILE *)ofp);
        fclose((FILE *)ofp);
        return;
      }
    } while( true );
  }
  __filename_00 = (msghdr *)pcVar18;
  __filename_02 = (qthdr *)outfile;
  do_permonst_cold_1();
  pcVar18 = "r";
  pcStack_188 = (code *)0x10a7f7;
  pcStack_68 = outfile;
  ifp = (FILE *)fopen((char *)__filename_02,"r");
  if ((FILE *)ifp == (FILE *)0x0) {
LAB_0010ad64:
    pcStack_188 = (code *)0x10ad6c;
    do_questtxt_cold_7();
  }
  else {
    pcVar18 = "w+";
    pcStack_188 = (code *)0x10a816;
    ofp = (FILE *)fopen((char *)__filename_00,"w+");
    if ((FILE *)ofp != (FILE *)0x0) {
      qt_hdr.n_hdr = 0;
      qt_line = 0;
      in_msg = '\0';
      pcStack_188 = (code *)0x10a853;
      pcVar18 = fgets(in_line,0x50,(FILE *)ifp);
      if (pcVar18 != (char *)0x0) {
        unaff_R12 = "%s %5d";
        unaff_R13 = acStack_170;
        unaff_RBP = &iStack_174;
        unaff_R15 = msg_hdr;
        do {
          qt_line = qt_line + 1;
          __filename_02 = (qthdr *)(ulong)(uint)qt_line;
          if ((in_line._0_4_ & 0xff) != 0x23) {
            if ((in_line._0_4_ & 0xff) == 0x25) {
              uVar5 = (uint)in_line._0_4_ >> 8 & 0xff;
              if (uVar5 == 0x45) {
                iStack_174 = 0;
                if (in_msg == '\0') {
                  pcVar18 = "End record encountered before message - line %d\n";
LAB_0010aa84:
                  iStack_174 = 0;
                  pcStack_188 = (code *)0x10aa8e;
                  fprintf(_stderr,pcVar18,(ulong)(uint)qt_line);
                }
                else {
                  in_msg = '\0';
                }
              }
              else {
                if (uVar5 != 0x43) goto LAB_0010a9e0;
                iStack_174 = 0;
                if (in_msg != '\0') {
                  pcVar18 = "Control record encountered during message - line %d\n";
                  goto LAB_0010aa84;
                }
                in_msg = '\x01';
                pcStack_188 = (code *)0x10a8f1;
                iVar4 = __isoc99_sscanf(in_line + 4,"%s %5d",unaff_R13,unaff_RBP);
                if (iVar4 == 2) {
                  pcStack_188 = (code *)0x10a902;
                  iVar4 = get_hdr(unaff_R13);
                  if (iVar4 == 0) {
                    if (0xf < (long)qt_hdr.n_hdr) {
                      pcStack_188 = (code *)0x10aaaa;
                      do_questtxt_cold_4();
                      goto LAB_0010aa41;
                    }
                    __filename_02 = &qt_hdr;
                    pcStack_188 = (code *)0x10a937;
                    strncpy(qt_hdr.id[qt_hdr.n_hdr],unaff_R13,3);
                    lVar8 = (long)qt_hdr.n_hdr;
                    msg_hdr[lVar8].n_msg = 0;
                    qt_hdr.n_hdr = qt_hdr.n_hdr + 1;
                    qt_hdr.offset[lVar8] = 0;
                  }
                  pcStack_188 = (code *)0x10a967;
                  iVar4 = get_hdr(unaff_R13);
                  lVar8 = (long)(iVar4 + -1);
                  lVar9 = lVar8 * 0x2ee8 + 0x1203f8;
                  iVar4 = msg_hdr[lVar8].n_msg;
                  lVar19 = (long)iVar4;
                  if (0 < lVar19) {
                    lVar22 = 0;
                    do {
                      if (*(int *)(lVar9 + lVar22) == iStack_174) {
                        pcStack_188 = (code *)0x10aa9c;
                        do_questtxt_cold_3();
                        goto LAB_0010aa41;
                      }
                      lVar22 = lVar22 + 0x18;
                    } while (lVar19 * 0x18 != lVar22);
                    if (499 < iVar4) {
                      pcStack_188 = (code *)0x10aaa3;
                      do_questtxt_cold_2();
                      goto LAB_0010aa41;
                    }
                  }
                  msg_hdr[lVar8].n_msg = iVar4 + 1;
                  curr_msg = (qtmsg *)(lVar9 + lVar19 * 0x18);
                  curr_msg->msgnum = iStack_174;
                  curr_msg->delivery = in_line[2];
                  curr_msg->offset = 0;
                  curr_msg->size = 0;
                }
                else {
                  pcStack_188 = (code *)0x10aa95;
                  do_questtxt_cold_1();
                }
              }
            }
            else {
LAB_0010a9e0:
              if (in_msg == '\0') {
                pcStack_188 = (code *)0x10aa06;
                sVar10 = strlen(in_line);
                if (sVar10 == 1) goto LAB_0010aa41;
                pcStack_188 = (code *)0x10aa27;
                fprintf(_stderr,"Text encountered outside message - line %d\n",__filename_02);
              }
              pcStack_188 = (code *)0x10a9f1;
              sVar10 = strlen(in_line);
              curr_msg->size = curr_msg->size + sVar10;
            }
          }
LAB_0010aa41:
          pcStack_188 = (code *)0x10aa55;
          pcVar18 = fgets(in_line,0x50,(FILE *)ifp);
          __filename_00 = (msghdr *)in_line;
        } while (pcVar18 != (char *)0x0);
      }
      pcStack_188 = (code *)0x10aabc;
      fseek((FILE *)ifp,0,0);
      in_msg = '\0';
      lVar8 = (long)qt_hdr.n_hdr;
      if (0 < lVar8) {
        plVar20 = qt_hdr.offset;
        lVar9 = lVar8 * 0xb + 4;
        lVar19 = 0;
        do {
          *plVar20 = lVar9;
          lVar9 = lVar9 + (long)*(int *)((long)msg_hdr[0].qt_msg + lVar19 + -8) * 0x18 + 4;
          lVar19 = lVar19 + 0x2ee8;
          plVar20 = plVar20 + 1;
        } while (lVar8 * 0x2ee8 - lVar19 != 0);
        lVar19 = 0x120408;
        lVar22 = 0;
        lVar23 = 0;
        do {
          iVar4 = msg_hdr[lVar22].n_msg;
          if (0 < (long)iVar4) {
            lVar24 = 0;
            do {
              *(long *)(lVar19 + -8 + lVar24) = lVar23 + lVar9;
              lVar23 = lVar23 + *(long *)(lVar19 + lVar24);
              lVar24 = lVar24 + 0x18;
            } while ((long)iVar4 * 0x18 != lVar24);
          }
          lVar22 = lVar22 + 1;
          lVar19 = lVar19 + 0x2ee8;
        } while (lVar22 != lVar8);
      }
      pcVar18 = (char *)0x4;
      pcStack_188 = (code *)0x10ab83;
      sVar10 = fwrite(&qt_hdr,4,1,(FILE *)ofp);
      if ((int)sVar10 == 1) {
        pcVar18 = (char *)0x3;
        pcStack_188 = (code *)0x10abab;
        sVar10 = fwrite(qt_hdr.id,3,(long)qt_hdr.n_hdr,(FILE *)ofp);
        if (qt_hdr.n_hdr == (int)sVar10) {
          pcVar18 = (char *)0x8;
          pcStack_188 = (code *)0x10abd2;
          sVar10 = fwrite(qt_hdr.offset,8,(long)(int)sVar10,(FILE *)ofp);
          if (qt_hdr.n_hdr == (int)sVar10) {
            if (0 < (int)sVar10) {
              __filename_00 = msg_hdr;
              __filename_02 = (qthdr *)0x0;
              do {
                pcVar18 = (char *)0x4;
                pcStack_188 = (code *)0x10ac05;
                sVar10 = fwrite(__filename_00,4,1,(FILE *)ofp);
                if ((int)sVar10 != 1) goto LAB_0010ad5f;
                pcVar18 = (char *)0x18;
                pcStack_188 = (code *)0x10ac26;
                sVar10 = fwrite(__filename_00->qt_msg,0x18,(long)__filename_00->n_msg,(FILE *)ofp);
                if (__filename_00->n_msg != (int)sVar10) goto LAB_0010ad5f;
                __filename_02 = (qthdr *)((long)&__filename_02->n_hdr + 1);
                __filename_00 = __filename_00 + 1;
              } while ((long)__filename_02 < (long)qt_hdr.n_hdr);
            }
            pcStack_188 = (code *)0x10ac5c;
            pcVar18 = fgets(in_line,0x50,(FILE *)ifp);
            uVar5 = in_line._0_4_;
            do {
              in_line._0_4_ = uVar5;
              if (pcVar18 == (char *)0x0) {
                pcStack_188 = (code *)0x10ad41;
                fclose((FILE *)ifp);
                pcStack_188 = (code *)0x10ad4d;
                fclose((FILE *)ofp);
                return;
              }
              uVar26 = uVar5 & 0xff;
              if (uVar26 != 0x23) {
                if ((uVar26 == 0x25) &&
                   ((uVar6 = uVar5 >> 8 & 0xff, uVar6 == 0x45 || (uVar6 == 0x43)))) {
                  in_msg = (char)(uVar5 >> 8) == 'C';
                }
                else {
                  if (in_msg == '\0') {
                    pcStack_188 = (code *)0x10acc7;
                    sVar10 = strlen(in_line);
                    if (sVar10 == 1) goto LAB_0010ad18;
                  }
                  pbVar11 = &xcrypt_buf;
                  if ((char)uVar5 != '\0') {
                    iVar4 = 1;
                    pcVar18 = in_line;
                    pbVar11 = &xcrypt_buf;
                    do {
                      pcVar18 = (char *)((byte *)pcVar18 + 1);
                      bVar17 = (byte)iVar4;
                      if ((uVar26 & 0x60) == 0) {
                        bVar17 = 0;
                      }
                      *pbVar11 = bVar17 ^ (byte)uVar26;
                      iVar4 = iVar4 * 2;
                      if (0x1f < iVar4) {
                        iVar4 = 1;
                      }
                      pbVar11 = pbVar11 + 1;
                      uVar26 = (uint)(byte)*pcVar18;
                    } while (*pcVar18 != 0);
                  }
                  *pbVar11 = 0;
                  pcStack_188 = (code *)0x10ad18;
                  fputs(&xcrypt_buf,(FILE *)ofp);
                }
              }
LAB_0010ad18:
              pcStack_188 = (code *)0x10ad2c;
              pcVar18 = fgets(in_line,0x50,(FILE *)ifp);
              uVar5 = in_line._0_4_;
            } while( true );
          }
        }
      }
LAB_0010ad5f:
      pcStack_188 = (code *)0x10ad64;
      do_questtxt_cold_5();
      goto LAB_0010ad64;
    }
  }
  pcStack_188 = do_rumors;
  __filename_03 = __filename_00;
  do_questtxt_cold_6();
  pcStack_1c0 = (code *)0x10ad97;
  pcStack_1b8 = extraout_RAX;
  pmStack_1b0 = __filename_00;
  pcStack_1a8 = unaff_R12;
  pcStack_1a0 = unaff_R13;
  pqStack_198 = __filename_02;
  pmStack_190 = unaff_R15;
  pcStack_188 = (code *)unaff_RBP;
  ofp = (FILE *)fopen(__filename,"w+");
  pcVar16 = __filename;
  if ((FILE *)ofp == (FILE *)0x0) {
    pcStack_1c0 = (code *)0x10afc3;
    do_rumors_cold_3();
LAB_0010afc3:
    pcStack_1c0 = (code *)0x10afcf;
    do_rumors_cold_2();
  }
  else {
    pcStack_1c0 = (code *)0x10adba;
    pcStack_1b8 = __filename;
    fputs("#\tThis data file is generated by \'makedefs\'.  Do not edit. \n",(FILE *)ofp);
    pcStack_1c0 = (code *)0x10adc9;
    ifp = (FILE *)fopen((char *)__filename_03,"r");
    if ((FILE *)ifp == (FILE *)0x0) goto LAB_0010afc3;
    unaff_R13 = (char *)0x0;
    pcStack_1c0 = (code *)0x10adeb;
    fseek((FILE *)ifp,0,2);
    pcStack_1c0 = (code *)0x10adf7;
    lVar8 = ftell((FILE *)ifp);
    pcStack_1c0 = (code *)0x10ae0f;
    fprintf((FILE *)ofp,"%06lx\n",lVar8);
    pcStack_1c0 = (code *)0x10ae1f;
    fseek((FILE *)ifp,0,0);
    pcStack_1c0 = (code *)0x10ae37;
    pcVar12 = fgets(in_line,0x100,(FILE *)ifp);
    if (pcVar12 != (char *)0x0) {
      __filename_03 = (msghdr *)&xcrypt_buf;
      unaff_R12 = in_line;
      unaff_RBP = (int *)(in_line + 1);
      pcVar16 = (char *)0x1;
      do {
        pbVar11 = &xcrypt_buf;
        if (in_line[0] != '\0') {
          iVar4 = 1;
          pcVar12 = in_line;
          pbVar11 = &xcrypt_buf;
          bVar17 = in_line[0];
          do {
            pcVar12 = (char *)((byte *)pcVar12 + 1);
            bVar21 = (byte)iVar4;
            if ((bVar17 & 0x60) == 0) {
              bVar21 = 0;
            }
            *pbVar11 = bVar21 ^ bVar17;
            iVar4 = iVar4 * 2;
            if (0x1f < iVar4) {
              iVar4 = 1;
            }
            pbVar11 = pbVar11 + 1;
            bVar17 = *pcVar12;
          } while (bVar17 != 0);
        }
        *pbVar11 = 0;
        pcStack_1c0 = (code *)0x10aeac;
        fputs(&xcrypt_buf,(FILE *)ofp);
        pcStack_1c0 = (code *)0x10aec0;
        pcVar12 = fgets(in_line,0x100,(FILE *)ifp);
      } while (pcVar12 != (char *)0x0);
    }
    pcStack_1c0 = (code *)0x10aed1;
    fclose((FILE *)ifp);
    pcStack_1c0 = (code *)0x10aee0;
    ifp = (FILE *)fopen(pcVar18,"r");
    if ((FILE *)ifp != (FILE *)0x0) {
      pcStack_1c0 = (code *)0x10af04;
      pcVar18 = fgets(in_line,0x100,(FILE *)ifp);
      while (pcVar18 != (char *)0x0) {
        pbVar11 = &xcrypt_buf;
        if (in_line[0] != '\0') {
          iVar4 = 1;
          pcVar18 = in_line;
          pbVar11 = &xcrypt_buf;
          bVar17 = in_line[0];
          do {
            pcVar18 = (char *)((byte *)pcVar18 + 1);
            bVar21 = (byte)iVar4;
            if ((bVar17 & 0x60) == 0) {
              bVar21 = 0;
            }
            *pbVar11 = bVar21 ^ bVar17;
            iVar4 = iVar4 * 2;
            if (0x1f < iVar4) {
              iVar4 = 1;
            }
            pbVar11 = pbVar11 + 1;
            bVar17 = *pcVar18;
          } while (bVar17 != 0);
        }
        *pbVar11 = 0;
        pcStack_1c0 = (code *)0x10af7c;
        fputs(&xcrypt_buf,(FILE *)ofp);
        pcStack_1c0 = (code *)0x10af90;
        pcVar18 = fgets(in_line,0x100,(FILE *)ifp);
      }
      pcStack_1c0 = (code *)0x10afa1;
      fclose((FILE *)ifp);
      fclose((FILE *)ofp);
      return;
    }
  }
  pcStack_1c0 = do_oracles;
  pcVar12 = pcStack_1b8;
  __filename_01 = pcVar18;
  do_rumors_cold_1();
  pcStack_1e8 = pcVar16;
  pcStack_1e0 = unaff_R12;
  pcStack_1d8 = unaff_R13;
  pcStack_1d0 = pcVar18;
  pmStack_1c8 = __filename_03;
  pcStack_1c0 = (code *)unaff_RBP;
  sprintf(acStack_3f0,"%s.%s",pcVar12,"tmp");
  ifp = (FILE *)fopen(__filename_01,"r");
  if ((FILE *)ifp == (FILE *)0x0) {
LAB_0010b4ec:
    do_oracles_cold_4();
  }
  else {
    ofp = (FILE *)fopen(pcVar12,"w+");
    if ((FILE *)ofp != (FILE *)0x0) {
      tfp = (FILE *)fopen(acStack_3f0,"w+");
      if ((FILE *)tfp != (FILE *)0x0) {
        fprintf((FILE *)ofp,"%s%5d\n",
                "#\tThis data file is generated by \'makedefs\'.  Do not edit. \n",0);
        fputs("---\n",(FILE *)tfp);
        pFVar3 = ofp;
        lVar8 = ftell((FILE *)tfp);
        fprintf((FILE *)pFVar3,"%05lx\n",lVar8);
        lVar8 = 0;
        do {
          pbVar11 = (byte *)special_oracle[lVar8];
          bVar17 = *pbVar11;
          pbVar14 = &xcrypt_buf;
          if (bVar17 != 0) {
            iVar4 = 1;
            pbVar14 = &xcrypt_buf;
            do {
              pbVar11 = pbVar11 + 1;
              bVar21 = (byte)iVar4;
              if ((bVar17 & 0x60) == 0) {
                bVar21 = 0;
              }
              *pbVar14 = bVar21 ^ bVar17;
              iVar4 = iVar4 * 2;
              if (0x1f < iVar4) {
                iVar4 = 1;
              }
              pbVar14 = pbVar14 + 1;
              bVar17 = *pbVar11;
            } while (bVar17 != 0);
          }
          *pbVar14 = 0;
          fputs(&xcrypt_buf,(FILE *)tfp);
          fputc(10,(FILE *)tfp);
          lVar8 = lVar8 + 1;
        } while (lVar8 != 10);
        fputs("---\n",(FILE *)tfp);
        pFVar3 = ofp;
        lVar8 = ftell((FILE *)tfp);
        fprintf((FILE *)pFVar3,"%05lx\n",lVar8);
        uVar5 = 1;
LAB_0010b1a5:
        bVar2 = true;
LAB_0010b1a8:
        while (pcVar18 = fgets(in_line,0x100,(FILE *)ifp), pcVar18 != (char *)0x0) {
          if (in_line[0] != '#') {
            __isoc99_sscanf(in_line,"----- %s",alStack_2f0);
            if (in_line[4] == '-' && in_line._0_4_ == 0x2d2d2d2d) goto code_r0x0010b1f4;
            pbVar11 = &xcrypt_buf;
            if (in_line[0] != '\0') {
              iVar4 = 1;
              pcVar18 = in_line;
              pbVar11 = &xcrypt_buf;
              bVar17 = in_line[0];
              do {
                pcVar18 = (char *)((byte *)pcVar18 + 1);
                bVar21 = (byte)iVar4;
                if ((bVar17 & 0x60) == 0) {
                  bVar21 = 0;
                }
                *pbVar11 = bVar21 ^ bVar17;
                iVar4 = iVar4 * 2;
                if (0x1f < iVar4) {
                  iVar4 = 1;
                }
                pbVar11 = pbVar11 + 1;
                bVar17 = *pcVar18;
              } while (bVar17 != 0);
            }
            *pbVar11 = 0;
            fputs(&xcrypt_buf,(FILE *)tfp);
            bVar2 = false;
          }
        }
        if (!bVar2) {
          uVar5 = uVar5 + 1;
          fputs("---\n",(FILE *)tfp);
          pFVar3 = ofp;
          lVar8 = ftell((FILE *)tfp);
          fprintf((FILE *)pFVar3,"%05lx\n",lVar8);
        }
        lVar8 = ftell((FILE *)ofp);
        fclose((FILE *)ifp);
        sprintf(in_line,"rewind of \"%s\"",acStack_3f0);
        iVar4 = fseek((FILE *)tfp,0,0);
        if (iVar4 == 0) {
          pcVar18 = fgets(in_line,0x100,(FILE *)tfp);
          while (pcVar18 != (char *)0x0) {
            fputs(in_line,(FILE *)ofp);
            pcVar18 = fgets(in_line,0x100,(FILE *)tfp);
          }
          fclose((FILE *)tfp);
          unlink(acStack_3f0);
          sprintf(in_line,"rewind of \"%s\"",pcVar12);
          iVar4 = fseek((FILE *)ofp,0,0);
          if (iVar4 == 0) {
            sprintf(in_line,"header rewrite of \"%s\"",pcVar12);
            iVar4 = fprintf((FILE *)ofp,"%s%5d\n",
                            "#\tThis data file is generated by \'makedefs\'.  Do not edit. \n",
                            (ulong)uVar5);
            if (-1 < iVar4) {
              sprintf(in_line,"data rewrite of \"%s\"",pcVar12);
              iVar4 = uVar5 + 1;
              while ((((lVar9 = ftell((FILE *)ofp), -1 < lVar9 &&
                       (iVar7 = fseek((FILE *)ofp,lVar9,0), -1 < iVar7)) &&
                      (iVar7 = __isoc99_fscanf(ofp,"%5lx",alStack_2f0), iVar7 == 1)) &&
                     ((iVar7 = fseek((FILE *)ofp,lVar9,0), -1 < iVar7 &&
                      (iVar7 = fprintf((FILE *)ofp,"%05lx\n",alStack_2f0[0] + lVar8), -1 < iVar7))))
                    ) {
                iVar4 = iVar4 + -1;
                if (iVar4 == 0) {
                  fclose((FILE *)ofp);
                  return;
                }
              }
            }
          }
        }
        do_oracles_cold_1();
        goto LAB_0010b4ec;
      }
      goto LAB_0010b4fc;
    }
  }
  do_oracles_cold_3();
LAB_0010b4fc:
  pcVar18 = acStack_3f0;
  do_oracles_cold_2();
  lVar8 = (long)qt_hdr.n_hdr;
  if (0 < lVar8) {
    __s2 = qt_hdr.id;
    lVar9 = 0;
    do {
      iVar4 = strncmp(pcVar18,*__s2,3);
      if (iVar4 == 0) {
        return;
      }
      lVar9 = lVar9 + 1;
      __s2 = __s2 + 1;
    } while (lVar8 != lVar9);
  }
  return;
code_r0x0010b1f4:
  bVar1 = !bVar2;
  bVar2 = true;
  if (bVar1) goto LAB_0010b26f;
  goto LAB_0010b1a8;
LAB_0010b26f:
  uVar5 = uVar5 + 1;
  fputs("---\n",(FILE *)tfp);
  pFVar3 = ofp;
  lVar8 = ftell((FILE *)tfp);
  fprintf((FILE *)pFVar3,"%05lx\n",lVar8);
  goto LAB_0010b1a5;
}

Assistant:

void do_permonst(const char *outfile)
{
	int	i;
	char	*c, *nam;

	if (!(ofp = fopen(outfile, WRTMODE))) {
		perror(outfile);
		exit(EXIT_FAILURE);
	}
	
	fprintf(ofp,"%s", Dont_Edit_Code);
	fprintf(ofp,"#ifndef PM_H\n#define PM_H\n");

	if (strcmp(mons[0].mname, "playermon") != 0)
		fprintf(ofp,"\n#define\tPM_PLAYERMON\t(-1)");

	for (i = 0; mons[i].mlet; i++) {
		fprintf(ofp,"\n#define\tPM_");
		if (mons[i].mlet == S_HUMAN &&
				!strncmp(mons[i].mname, "were", 4))
		    fprintf(ofp, "HUMAN_");
		for (nam = c = tmpdup(mons[i].mname); *c; c++)
		    if (*c >= 'a' && *c <= 'z') *c -= (char)('a' - 'A');
		    else if (*c < 'A' || *c > 'Z') *c = '_';
		fprintf(ofp,"%s\t%d", nam, i);
	}
	fprintf(ofp,"\n\n#define\tNUMMONS\t%d\n", i);
	fprintf(ofp,"\n#endif /* PM_H */\n");
	fclose(ofp);
	return;
}